

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

void CP_validateParams(SstStream Stream,SstParams Params,int Writer)

{
  uint uVar1;
  int iVar2;
  __int32_t *p_Var3;
  int iVar4;
  undefined8 in_RAX;
  size_t sVar5;
  char *pcVar6;
  __int32_t **pp_Var7;
  long lVar8;
  char *pcVar9;
  char cVar10;
  int tmp;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  uVar1 = Params->RendezvousReaderCount;
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"Invalid RendezvousReaderCount parameter value (%d) for SST Stream %s\n",
            (ulong)uVar1,Stream->Filename);
  }
  else {
    Stream->RendezvousReaderCount = uVar1;
  }
  uVar1 = Params->QueueLimit;
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"Invalid QueueLimit parameter value (%d) for SST Stream %s\n",(ulong)uVar1,
            Stream->Filename);
  }
  else {
    Stream->QueueLimit = uVar1;
  }
  Stream->QueueFullPolicy = (SstQueueFullPolicy)Params->QueueFullPolicy;
  Stream->RegistrationMethod = (SstRegistrationMethod)Params->RegistrationMethod;
  pcVar9 = Params->DataTransport;
  if (pcVar9 != (char *)0x0) {
    sVar5 = strlen(pcVar9);
    pcVar6 = (char *)malloc(sVar5 + 1);
    cVar10 = *pcVar9;
    if (cVar10 == '\0') {
      lVar8 = 0;
    }
    else {
      pp_Var7 = __ctype_tolower_loc();
      p_Var3 = *pp_Var7;
      lVar8 = 0;
      do {
        pcVar6[lVar8] = (char)p_Var3[cVar10];
        cVar10 = pcVar9[lVar8 + 1];
        lVar8 = lVar8 + 1;
      } while (cVar10 != '\0');
    }
    pcVar6[lVar8] = '\0';
    free(pcVar9);
    iVar4 = strcmp(pcVar6,"wan");
    if ((iVar4 == 0) || (iVar4 = strcmp(pcVar6,"evpath"), iVar4 == 0)) {
      pcVar9 = "evpath";
    }
    else {
      iVar4 = strcmp(pcVar6,"rdma");
      if (((iVar4 == 0) || (iVar4 = strcmp(pcVar6,"ib"), iVar4 == 0)) ||
         (iVar4 = strcmp(pcVar6,"fabric"), iVar4 == 0)) {
        pcVar9 = "rdma";
      }
      else {
        iVar4 = strcmp(pcVar6,"ucx");
        pcVar9 = pcVar6;
        if (iVar4 == 0) {
          pcVar9 = "ucx";
        }
      }
    }
    pcVar9 = strdup(pcVar9);
    Params->DataTransport = pcVar9;
    free(pcVar6);
  }
  pcVar9 = Params->ControlTransport;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = strdup("sockets");
    Params->ControlTransport = pcVar9;
  }
  else {
    sVar5 = strlen(pcVar9);
    pcVar6 = (char *)malloc(sVar5 + 1);
    cVar10 = *pcVar9;
    if (cVar10 == '\0') {
      lVar8 = 0;
    }
    else {
      pp_Var7 = __ctype_tolower_loc();
      p_Var3 = *pp_Var7;
      lVar8 = 0;
      do {
        pcVar6[lVar8] = (char)p_Var3[cVar10];
        cVar10 = pcVar9[lVar8 + 1];
        lVar8 = lVar8 + 1;
      } while (cVar10 != '\0');
    }
    pcVar6[lVar8] = '\0';
    iVar4 = strcmp(pcVar6,"sockets");
    if ((iVar4 == 0) || (iVar4 = strcmp(pcVar6,"tcp"), iVar4 == 0)) {
      pcVar9 = "sockets";
LAB_00113214:
      pcVar9 = strdup(pcVar9);
      Params->ControlTransport = pcVar9;
    }
    else {
      iVar4 = strcmp(pcVar6,"udp");
      if (((iVar4 == 0) || (iVar4 = strcmp(pcVar6,"rudp"), iVar4 == 0)) ||
         ((iVar4 = strcmp(pcVar6,"scalable"), iVar4 == 0 ||
          (iVar4 = strcmp(pcVar6,"enet"), iVar4 == 0)))) {
        pcVar9 = "enet";
        goto LAB_00113214;
      }
    }
    free(pcVar6);
  }
  Stream->ConnectionUsleepMultiplier = 0x32;
  iVar4 = strcmp(Params->ControlTransport,"enet");
  if ((iVar4 == 0) && (pcVar9 = getenv("USLEEP_MULTIPLIER"), pcVar9 != (char *)0x0)) {
    __isoc99_sscanf("%d",pcVar9,&Stream->ConnectionUsleepMultiplier);
  }
  pcVar9 = Params->ControlTransport;
  cVar10 = *pcVar9;
  if (cVar10 != '\0') {
    lVar8 = 1;
    pp_Var7 = __ctype_tolower_loc();
    pcVar6 = pcVar9;
    do {
      *pcVar6 = (char)(*pp_Var7)[cVar10];
      pcVar9 = Params->ControlTransport;
      pcVar6 = pcVar9 + lVar8;
      cVar10 = pcVar9[lVar8];
      lVar8 = lVar8 + 1;
    } while (cVar10 != '\0');
  }
  iVar4 = strcmp(pcVar9,"enet");
  if ((iVar4 == 0) && (pcVar9 = getenv("USLEEP_MULTIPLIER"), pcVar9 != (char *)0x0)) {
    pcVar9 = getenv("USLEEP_MULTIPLIER");
    iVar4 = __isoc99_sscanf(pcVar9,"%d",&local_34);
    if (iVar4 == 1) {
      Stream->ConnectionUsleepMultiplier = local_34;
    }
    CP_verbose(Stream,PerStepVerbose,"USING %d as usleep multiplier before connections\n",
               (ulong)(uint)Stream->ConnectionUsleepMultiplier);
  }
  CP_verbose(Stream,PerStepVerbose,"Sst set to use %s as a Control Transport\n",
             Params->ControlTransport);
  pcVar9 = Params->ControlModule;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = strdup("select");
    Params->ControlModule = pcVar9;
    goto LAB_001133ec;
  }
  sVar5 = strlen(pcVar9);
  pcVar6 = (char *)malloc(sVar5 + 1);
  cVar10 = *pcVar9;
  if (cVar10 == '\0') {
    lVar8 = 0;
  }
  else {
    pp_Var7 = __ctype_tolower_loc();
    p_Var3 = *pp_Var7;
    lVar8 = 0;
    do {
      pcVar6[lVar8] = (char)p_Var3[cVar10];
      cVar10 = pcVar9[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (cVar10 != '\0');
  }
  pcVar6[lVar8] = '\0';
  iVar4 = strcmp(pcVar6,"select");
  if (iVar4 == 0) {
    pcVar9 = "select";
LAB_001133d8:
    pcVar9 = strdup(pcVar9);
    Params->ControlModule = pcVar9;
  }
  else {
    iVar4 = strcmp(pcVar6,"epoll");
    if (iVar4 == 0) {
      pcVar9 = "epoll";
      goto LAB_001133d8;
    }
    fprintf(_stderr,"Invalid ControlModule parameter (%s) for SST Stream %s\n",pcVar9,
            Stream->Filename);
  }
  free(pcVar6);
LAB_001133ec:
  iVar4 = Params->verbose;
  iVar2 = Stream->CPVerbosityLevel;
  if (iVar2 < iVar4) {
    Stream->CPVerbosityLevel = iVar4;
  }
  else if (iVar4 < iVar2) {
    Params->verbose = iVar2;
  }
  return;
}

Assistant:

void CP_validateParams(SstStream Stream, SstParams Params, int Writer)
{
    if (Params->RendezvousReaderCount >= 0)
    {
        Stream->RendezvousReaderCount = Params->RendezvousReaderCount;
    }
    else
    {
        fprintf(stderr,
                "Invalid RendezvousReaderCount parameter value (%d) "
                "for SST Stream %s\n",
                Params->RendezvousReaderCount, Stream->Filename);
    }
    if (Params->QueueLimit >= 0)
    {
        Stream->QueueLimit = Params->QueueLimit;
    }
    else
    {
        fprintf(stderr, "Invalid QueueLimit parameter value (%d) for SST Stream %s\n",
                Params->QueueLimit, Stream->Filename);
    }
    Stream->QueueFullPolicy = (SstQueueFullPolicy)Params->QueueFullPolicy;
    Stream->RegistrationMethod = (SstRegistrationMethod)Params->RegistrationMethod;
    if (Params->DataTransport != NULL)
    {
        int i;
        char *SelectedTransport = malloc(strlen(Params->DataTransport) + 1);
        for (i = 0; Params->DataTransport[i] != 0; i++)
        {
            SelectedTransport[i] = tolower(Params->DataTransport[i]);
        }
        SelectedTransport[i] = 0;
        /* free old */
        free(Params->DataTransport);

        /* canonicalize SelectedTransport */
        if ((strcmp(SelectedTransport, "wan") == 0) || (strcmp(SelectedTransport, "evpath") == 0))
        {
            Params->DataTransport = strdup("evpath");
        }
        else if ((strcmp(SelectedTransport, "rdma") == 0) ||
                 (strcmp(SelectedTransport, "ib") == 0) ||
                 (strcmp(SelectedTransport, "fabric") == 0))
        {
            Params->DataTransport = strdup("rdma");
        }
        else if (strcmp(SelectedTransport, "ucx") == 0)
        {
            Params->DataTransport = strdup("ucx");
        }
        else
        {
            Params->DataTransport = strdup(SelectedTransport);
        }
        free(SelectedTransport);
    }
    if (Params->ControlTransport == NULL)
    {
        /* determine reasonable default, now "sockets" */
        Params->ControlTransport = strdup("sockets");
    }
    else
    {
        int i;
        char *SelectedTransport = malloc(strlen(Params->ControlTransport) + 1);
        for (i = 0; Params->ControlTransport[i] != 0; i++)
        {
            SelectedTransport[i] = tolower(Params->ControlTransport[i]);
        }
        SelectedTransport[i] = 0;

        /* canonicalize SelectedTransport */
        if ((strcmp(SelectedTransport, "sockets") == 0) || (strcmp(SelectedTransport, "tcp") == 0))
        {
            Params->ControlTransport = strdup("sockets");
        }
        else if ((strcmp(SelectedTransport, "udp") == 0) ||
                 (strcmp(SelectedTransport, "rudp") == 0) ||
                 (strcmp(SelectedTransport, "scalable") == 0) ||
                 (strcmp(SelectedTransport, "enet") == 0))
        {
            Params->ControlTransport = strdup("enet");
        }
        free(SelectedTransport);
    }
    Stream->ConnectionUsleepMultiplier = 50;
    if ((strcmp(Params->ControlTransport, "enet") == 0) && getenv("USLEEP_MULTIPLIER"))
    {
        sscanf("%d", getenv("USLEEP_MULTIPLIER"), &Stream->ConnectionUsleepMultiplier);
    }
    for (int i = 0; Params->ControlTransport[i] != 0; i++)
    {
        Params->ControlTransport[i] = tolower(Params->ControlTransport[i]);
    }
    if ((strcmp(Params->ControlTransport, "enet") == 0) && getenv("USLEEP_MULTIPLIER"))
    {
        int tmp;
        if (sscanf(getenv("USLEEP_MULTIPLIER"), "%d", &tmp) == 1)
        {
            Stream->ConnectionUsleepMultiplier = tmp;
        }
        CP_verbose(Stream, PerStepVerbose, "USING %d as usleep multiplier before connections\n",
                   Stream->ConnectionUsleepMultiplier);
    }
    CP_verbose(Stream, PerStepVerbose, "Sst set to use %s as a Control Transport\n",
               Params->ControlTransport);
    if (Params->ControlModule != NULL)
    {
        int i;
        char *SelectedModule = malloc(strlen(Params->ControlModule) + 1);
        for (i = 0; Params->ControlModule[i] != 0; i++)
        {
            SelectedModule[i] = tolower(Params->ControlModule[i]);
        }
        SelectedModule[i] = 0;

        /* canonicalize SelectedModule */
        if (strcmp(SelectedModule, "select") == 0)
        {
            Params->ControlModule = strdup("select");
        }
        else if (strcmp(SelectedModule, "epoll") == 0)
        {
            Params->ControlModule = strdup("epoll");
        }
        else
        {
            fprintf(stderr, "Invalid ControlModule parameter (%s) for SST Stream %s\n",
                    Params->ControlModule, Stream->Filename);
        }
        free(SelectedModule);
    }
    else
    {
        Params->ControlModule = strdup("select");
    }
    if (Params->verbose > Stream->CPVerbosityLevel)
    {
        Stream->CPVerbosityLevel = Params->verbose;
    }
    else if (Params->verbose < Stream->CPVerbosityLevel)
    {
        Params->verbose = Stream->CPVerbosityLevel;
    }
}